

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall glslang::TReflection::~TReflection(TReflection *this)

{
  TReflection *this_local;
  
  this->_vptr_TReflection = (_func_int **)&PTR__TReflection_010d8940;
  std::vector<int,_std::allocator<int>_>::~vector(&this->atomicCounterUniformIndices);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToPipeOutput);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToPipeInput);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToBufferBlock);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToBufferVariable);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToUniformBlock);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToUniform);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&this->pipeOutNameToIndex);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&this->pipeInNameToIndex);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&this->nameToIndex);
  TObjectReflection::~TObjectReflection(&this->badReflection);
  return;
}

Assistant:

virtual ~TReflection() {}